

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_base_foreach_event_nolock_(event_base *base,event_base_foreach_event_cb fn,void *arg)

{
  int iVar1;
  uint uVar2;
  long in_RAX;
  ulong uVar3;
  event *peVar4;
  long lVar5;
  undefined8 uStack_38;
  
  iVar1 = evmap_foreach_event_(base,fn,arg);
  if (iVar1 == 0) {
    if ((base->timeheap).n != 0) {
      uVar3 = 0;
      do {
        peVar4 = (base->timeheap).p[uVar3];
        if ((((peVar4->ev_evcallback).evcb_flags & 2) == 0) &&
           (iVar1 = (*fn)(base,peVar4,arg), iVar1 != 0)) {
          return iVar1;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (base->timeheap).n);
    }
    uStack_38 = in_RAX;
    if (0 < base->n_common_timeouts) {
      lVar5 = 0;
      do {
        for (peVar4 = (base->common_timeout_queues[lVar5]->events).tqh_first; peVar4 != (event *)0x0
            ; peVar4 = (peVar4->ev_timeout_pos).ev_next_with_common_timeout.tqe_next) {
          if ((((peVar4->ev_evcallback).evcb_flags & 2) == 0) &&
             (uVar2 = (*fn)(base,peVar4,arg), uVar2 != 0)) {
            uStack_38 = (ulong)uVar2 << 0x20;
            break;
          }
        }
        if (peVar4 != (event *)0x0) {
          return uStack_38._4_4_;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < base->n_common_timeouts);
    }
    if (0 < base->nactivequeues) {
      lVar5 = 0;
      do {
        for (peVar4 = (event *)base->activequeues[lVar5].tqh_first; peVar4 != (event *)0x0;
            peVar4 = (event *)(peVar4->ev_evcallback).evcb_active_next.tqe_next) {
          if ((((peVar4->ev_evcallback).evcb_flags & 0x83U) == 0x80) &&
             (uVar2 = (*fn)(base,peVar4,arg), uVar2 != 0)) {
            uStack_38 = (ulong)uVar2 << 0x20;
            break;
          }
        }
        if (peVar4 != (event *)0x0) {
          return uStack_38._4_4_;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < base->nactivequeues);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
event_base_foreach_event_nolock_(struct event_base *base,
    event_base_foreach_event_cb fn, void *arg)
{
	int r, i;
	unsigned u;
	struct event *ev;

	/* Start out with all the EVLIST_INSERTED events. */
	if ((r = evmap_foreach_event_(base, fn, arg)))
		return r;

	/* Okay, now we deal with those events that have timeouts and are in
	 * the min-heap. */
	for (u = 0; u < base->timeheap.n; ++u) {
		ev = base->timeheap.p[u];
		if (ev->ev_flags & EVLIST_INSERTED) {
			/* we already processed this one */
			continue;
		}
		if ((r = fn(base, ev, arg)))
			return r;
	}

	/* Now for the events in one of the timeout queues.
	 * the min-heap. */
	for (i = 0; i < base->n_common_timeouts; ++i) {
		struct common_timeout_list *ctl =
		    base->common_timeout_queues[i];
		TAILQ_FOREACH(ev, &ctl->events,
		    ev_timeout_pos.ev_next_with_common_timeout) {
			if (ev->ev_flags & EVLIST_INSERTED) {
				/* we already processed this one */
				continue;
			}
			if ((r = fn(base, ev, arg)))
				return r;
		}
	}

	/* Finally, we deal wit all the active events that we haven't touched
	 * yet. */
	for (i = 0; i < base->nactivequeues; ++i) {
		struct event_callback *evcb;
		TAILQ_FOREACH(evcb, &base->activequeues[i], evcb_active_next) {
			if ((evcb->evcb_flags & (EVLIST_INIT|EVLIST_INSERTED|EVLIST_TIMEOUT)) != EVLIST_INIT) {
				/* This isn't an event (evlist_init clear), or
				 * we already processed it. (inserted or
				 * timeout set */
				continue;
			}
			ev = event_callback_to_event(evcb);
			if ((r = fn(base, ev, arg)))
				return r;
		}
	}

	return 0;
}